

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour.c
# Opt level: O0

char * detour_print_info(void)

{
  return 
  "Detour Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *detour_print_info(void)
{
	static const char detour_info[] =
		"Detour Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef DETOUR_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return detour_info;
}